

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_862632::X509Test_CommonNameAndNameConstraints_Test::TestBody
          (X509Test_CommonNameAndNameConstraints_Test *this)

{
  UniquePtr<X509> UVar1;
  int iVar2;
  char *in_RCX;
  AssertionResult *lhs;
  int *piVar3;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  initializer_list<x509_st_*> __l_01;
  initializer_list<x509_st_*> __l_02;
  initializer_list<x509_st_*> __l_03;
  initializer_list<x509_st_*> __l_04;
  allocator_type local_142;
  allocator_type local_141;
  AssertionResult gtest_ar_;
  _Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_128;
  AssertionResult gtest_ar;
  anon_class_16_2_a4d0f9f0 verify_cert;
  int local_d4;
  AssertionResult gtest_ar_2;
  UniquePtr<X509> intermediate;
  UniquePtr<X509> not_dns;
  UniquePtr<X509> not_permitted_with_sans;
  UniquePtr<X509> not_permitted;
  UniquePtr<X509> root;
  int local_94;
  UniquePtr<X509> permitted;
  tuple<x509_st_*,_bssl::internal::Deleter> local_88;
  tuple<x509_st_*,_bssl::internal::Deleter> local_80;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  CertFromPEM((anon_unknown_dwarf_862632 *)&root,
              "\n-----BEGIN CERTIFICATE-----\nMIICTTCCAbagAwIBAgIIAj5CwoHlWuYwDQYJKoZIhvcNAQELBQAwKzEXMBUGA1UE\nChMOQm9yaW5nU1NMIFRlc3QxEDAOBgNVBAMTB1Jvb3QgQ0EwHhcNMTUwMTAxMDAw\nMDAwWhcNMjUwMTAxMDAwMDAwWjArMRcwFQYDVQQKEw5Cb3JpbmdTU0wgVGVzdDEQ\nMA4GA1UEAxMHUm9vdCBDQTCBnzANBgkqhkiG9w0BAQEFAAOBjQAwgYkCgYEA6Q5/\nEQzmWuaGg3D2UQcuAngR9bIkkjjuJmICx5TxPqF3asCP1SJotl3iTNrghRE1wpJy\nSY2BtIiXa7f8skRb2U0GcPkMxo/ps9+jaoRsQ1m+nbLQdpvD1/qZWcO45fNTA71J\n1rPMokP+rcILuQG4VimUAySnDSghKamulFtK+Z8CAwEAAaN6MHgwDgYDVR0PAQH/\nBAQDAgIEMB0GA1UdJQQWMBQGCCsGAQUFBwMBBggrBgEFBQcDAjAPBgNVHRMBAf8E\nBTADAQH/MBkGA1UdDgQSBBBAN9cB+0AvuBx+VAQnjFkBMBsGA1UdIwQUMBKAEEA3\n1wH7QC+4HH5UBCeMWQEwDQYJKoZIhvcNAQELBQADgYEAc4N6hTE62/3gwg+kyc2f\nc/Jj1mHrOt+0NRaBnmvbmNpsEjHS96Ef4Wt/ZlPXPkkv1C1VosJnOIMF3Q522wRH\nbqaxARldS12VAa3gcWisDWD+SqSyDxjyojz0XDiJkTrFuCTCUiZO+1GLB7SO10Ms\nd5YVX0c90VMnUhF/dlrqS9U=\n-----END CERTIFICATE-----\n"
             );
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
       root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
      root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&local_128);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x520523,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&verify_cert,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0xceb,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&verify_cert,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    CertFromPEM((anon_unknown_dwarf_862632 *)&intermediate,
                "\n-----BEGIN CERTIFICATE-----\nMIICDjCCAXegAwIBAgIBAjANBgkqhkiG9w0BAQsFADArMRcwFQYDVQQKEw5Cb3Jp\nbmdTU0wgVGVzdDEQMA4GA1UEAxMHUm9vdCBDQTAgFw0wMDAxMDEwMDAwMDBaGA8y\nMDk5MDEwMTAwMDAwMFowKDEmMCQGA1UEAxMdTmFtZSBDb25zdHJhaW50cyBJbnRl\ncm1lZGlhdGUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASbbbWYiN6mn+BCpg4X\nNpibOH0D/DN4kZ5C/Ml2YVomC9T83OKk2CzB8fPAabPb4P4Vv+fIabpEfjWS5nzK\nLY1yo4GJMIGGMA8GA1UdEwEB/wQFMAMBAf8wGwYDVR0jBBQwEoAQQDfXAftAL7gc\nflQEJ4xZATBWBgNVHR4BAf8ETDBKoCowEYIPcGVybWl0dGVkMS50ZXN0MBWCE2Zv\nby5wZXJtaXR0ZWQyLnRlc3ShHDAaghhleGNsdWRlZC5wZXJtaXR0ZWQxLnRlc3Qw\nDQYJKoZIhvcNAQELBQADgYEAFq1Ka05hiKREwRpSceQPzIIH4B5a5IVBg5/EvmQI\n9V0fXyAE1GmahPt70sIBxIgzNTEaY8P/IoOuCdlZWe0msmyEO3S6YSAzOWR5Van6\ncXmFM1uMd95TlkxUMRdV+jKJTvG6R/BM2zltaV7Xt662k5HtzT5Svw0rZlFaggZz\nUyM=\n-----END CERTIFICATE-----\n"
               );
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
         intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&local_128);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4fe128,"false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&verify_cert,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0xced,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=((AssertHelper *)&verify_cert,(Message *)&local_128)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      CertFromPEM((anon_unknown_dwarf_862632 *)&permitted,
                  "\n-----BEGIN CERTIFICATE-----\nMIIBaDCCAQ2gAwIBAgIBAzAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowPjEeMBwGA1UEChMVQ29tbW9uIG5hbWUgcGVybWl0dGVkMRwwGgYD\nVQQDExNmb28ucGVybWl0dGVkMS50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0DAQcD\nQgAENX5Ycs8q8MRzPYUz6DqLHhJR3wcmniFRgkiEa7MxE/mRe00y0VGwH7xi7Aoc\nemXPrtD4JwN5bssbcxWGAKYYzaMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjOPQQD\nAgNJADBGAiEAtsnWuRQXtw2xbieC78Y8SVEtTjcZUx8uZyQe1GPLfGICIQDR4fNY\nyg3PC94ydPNQZVsFxAne32CbonWWsokalTFpUQ==\n-----END CERTIFICATE-----\n"
                 );
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           permitted._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          permitted._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
        testing::Message::Message((Message *)&local_128);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x4fdd32,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&verify_cert,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0xcef,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&verify_cert,(Message *)&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        CertFromPEM((anon_unknown_dwarf_862632 *)&not_permitted,
                    "\n-----BEGIN CERTIFICATE-----\nMIIBazCCARCgAwIBAgIBBDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowQTEiMCAGA1UEChMZQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZDEb\nMBkGA1UEAxMSbm90LXBlcm1pdHRlZC50ZXN0MFkwEwYHKoZIzj0CAQYIKoZIzj0D\nAQcDQgAEzfghKuWf0JoXb0Drp09C3yXMSQQ1byt+AUaymvsHOWsxQ9v1Q+vkF/IM\nHRqGTk2TyxrB2iClVEn/Uu+YtYox1KMQMA4wDAYDVR0TAQH/BAIwADAKBggqhkjO\nPQQDAgNJADBGAiEAxaUslxmoWL1tIvnDz7gDkto/HcmdU0jHVuUQLXcCG8wCIQCN\n5xZjitlCQU8UB5qSu9wH4B+0JcVO3Ss4Az76HEJWMw==\n-----END CERTIFICATE-----\n"
                   );
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ =
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
             not_permitted._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
             (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
        if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
            not_permitted._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
            (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
          testing::Message::Message((Message *)&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"not_permitted",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&verify_cert,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0xcf2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&verify_cert,(Message *)&local_128);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          CertFromPEM((anon_unknown_dwarf_862632 *)&not_permitted_with_sans,
                      "\n-----BEGIN CERTIFICATE-----\nMIIBqTCCAU+gAwIBAgIBBjAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowSzEsMCoGA1UEChMjQ29tbW9uIG5hbWUgbm90IHBlcm1pdHRlZCB3\naXRoIFNBTlMxGzAZBgNVBAMTEm5vdC1wZXJtaXR0ZWQudGVzdDBZMBMGByqGSM49\nAgEGCCqGSM49AwEHA0IABKsn9wOApXFHrqhLdQgbFSeaSoAIbxgO0zVSRZUb5naR\n93zoL3MFOvZEF8xiEqh7le+l3XuUig0fwqpcsZzRNJajRTBDMAwGA1UdEwEB/wQC\nMAAwMwYDVR0RBCwwKoITZm9vLnBlcm1pdHRlZDEudGVzdIITZm9vLnBlcm1pdHRl\nZDIudGVzdDAKBggqhkjOPQQDAgNIADBFAiACk+1f184KkKAXuntmrz+Ygcq8MiZl\n4delx44FtcNaegIhAIA5nYfzxNcTXxDo3U+x1vSLH6Y7faLvHiFySp7O//q+\n-----END CERTIFICATE-----\n"
                     );
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ =
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
               not_permitted_with_sans._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
          if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
              not_permitted_with_sans._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
            testing::Message::Message((Message *)&local_128);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"not_permitted_with_sans","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&verify_cert,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                       ,0xcf5,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&verify_cert,(Message *)&local_128);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_.message_);
            CertFromPEM((anon_unknown_dwarf_862632 *)&not_dns,
                        "\n-----BEGIN CERTIFICATE-----\nMIIBYTCCAQagAwIBAgIBCDAKBggqhkjOPQQDAjAoMSYwJAYDVQQDEx1OYW1lIENv\nbnN0cmFpbnRzIEludGVybWVkaWF0ZTAgFw0wMDAxMDEwMDAwMDBaGA8yMDk5MDEw\nMTAwMDAwMFowNzEcMBoGA1UEChMTQ29tbW9uIG5hbWUgbm90IEROUzEXMBUGA1UE\nAxMOTm90IGEgRE5TIG5hbWUwWTATBgcqhkjOPQIBBggqhkjOPQMBBwNCAASnueyc\nZxtnw5ke2J2T0/LwAK37auQP/RSFd9mem+BJVbgviawtAlignJmafp7Zw4/GdYEJ\nVm8qlriOJtluvXGcoxAwDjAMBgNVHRMBAf8EAjAAMAoGCCqGSM49BAMCA0kAMEYC\nIQChUAmVNI39VHe0zemRE09VDcSEgOxr1nTvjLcg/Q8pVQIhAJYZnJI0YZAi05QH\nRHNlAkTK2TnUaVn3fGSylaLiFS1r\n-----END CERTIFICATE-----\n"
                       );
            this_00 = &gtest_ar_.message_;
            gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            gtest_ar_.success_ =
                 (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                 not_dns._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
            if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
                not_dns._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
                (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
              testing::Message::Message((Message *)&local_128);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"not_dns",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&verify_cert,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                         ,0xcf7,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&verify_cert,(Message *)&local_128);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&verify_cert);
              std::__cxx11::string::~string((string *)&gtest_ar);
              if (local_128._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                (*(code *)(*local_128._M_impl.super__Vector_impl_data._M_start)->sig_alg)();
              }
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(this_00);
              gtest_ar_.success_ = true;
              gtest_ar_._1_3_ = 0;
              verify_cert.root = &root;
              verify_cert.intermediate = &intermediate;
              iVar2 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                (&verify_cert,
                                 (X509 *)permitted._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 0x4f0f20,in_RCX);
              local_128._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2)
              ;
              lhs = &gtest_ar_;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"67",
                         "verify_cert(permitted.get(), 0 , kCommonNamePermitted)",(int *)lhs,
                         (int *)&local_128);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                lhs = (AssertionResult *)0xd08;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd08,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              gtest_ar_.success_ = true;
              gtest_ar_._1_3_ = 0;
              iVar2 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                (&verify_cert,
                                 (X509 *)not_permitted._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 0x4f0f40,&lhs->success_);
              local_128._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"67",
                         "verify_cert(not_permitted.get(), 0 , kCommonNameNotPermitted)",
                         (int *)&gtest_ar_,(int *)&local_128);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd0b,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              local_d4 = 0x43;
              local_80.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l._M_len = 1;
              __l._M_array = (iterator)&local_80;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,__l,&local_141);
              local_88.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_00._M_len = 1;
              __l_00._M_array = (iterator)&local_88;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_00,
                         &local_142);
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_38._M_unused._M_object = (void *)0x0;
              local_38._8_8_ = 0;
              local_28 = 0;
              uStack_20 = 0;
              local_94 = Verify((X509 *)not_permitted._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                                (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_128,
                                0,(function<void_(x509_store_ctx_st_*)> *)&local_38);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar_2,"67",
                         "Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {}, 0 , nullptr)"
                         ,&local_d4,&local_94);
              std::_Function_base::~_Function_base((_Function_base *)&local_38);
              std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                        (&local_128);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar);
              if (gtest_ar_2.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd11,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
                if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_2.message_);
              UVar1 = not_permitted_with_sans;
              local_d4 = 0;
              local_80.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)&local_80;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,__l_01,
                         &local_141);
              local_88.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_02._M_len = 1;
              __l_02._M_array = (iterator)&local_88;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_02,
                         &local_142);
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_58._M_unused._M_object = (void *)0x0;
              local_58._8_8_ = 0;
              local_48 = 0;
              uStack_40 = 0;
              local_94 = Verify((X509 *)UVar1._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                                (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_128,
                                0,(function<void_(x509_store_ctx_st_*)> *)&local_58);
              piVar3 = &local_d4;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar_2,"0",
                         "Verify(not_permitted_with_sans.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)"
                         ,piVar3,&local_94);
              std::_Function_base::~_Function_base((_Function_base *)&local_58);
              std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                        (&local_128);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar);
              if (gtest_ar_2.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                piVar3 = (int *)0xd16;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd16,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
                if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_2.message_);
              gtest_ar_.success_ = true;
              gtest_ar_._1_3_ = 0;
              iVar2 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                (&verify_cert,
                                 (X509 *)not_permitted_with_sans._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 0x4f0f60,(char *)piVar3);
              local_128._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"62",
                         "verify_cert(not_permitted_with_sans.get(), 0 , kCommonNameNotPermittedWithSANs)"
                         ,(int *)&gtest_ar_,(int *)&local_128);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd19,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              UVar1 = not_dns;
              local_d4 = 0;
              local_80.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   root._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_03._M_len = 1;
              __l_03._M_array = (iterator)&local_80;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,__l_03,
                         &local_141);
              local_88.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   (_Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>)
                   intermediate._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
              __l_04._M_len = 1;
              __l_04._M_array = (iterator)&local_88;
              std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                        ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,__l_04,
                         &local_142);
              local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_78._M_unused._M_object = (void *)0x0;
              local_78._8_8_ = 0;
              local_68 = 0;
              uStack_60 = 0;
              local_94 = Verify((X509 *)UVar1._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar,
                                (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_,
                                (vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> *)&local_128,
                                0,(function<void_(x509_store_ctx_st_*)> *)&local_78);
              piVar3 = &local_d4;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar_2,"0",
                         "Verify(not_dns.get(), {root.get()}, {intermediate.get()}, {}, 0, nullptr)"
                         ,piVar3,&local_94);
              std::_Function_base::~_Function_base((_Function_base *)&local_78);
              std::_Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>::~_Vector_base
                        (&local_128);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar_);
              std::_Vector_base<x509_st_*,_std::allocator<x509_st_*>_>::~_Vector_base
                        ((_Vector_base<x509_st_*,_std::allocator<x509_st_*>_> *)&gtest_ar);
              if (gtest_ar_2.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_2.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                piVar3 = (int *)0xd1e;
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd1e,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_,(Message *)&gtest_ar);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
                if ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_2.message_);
              gtest_ar_.success_ = true;
              gtest_ar_._1_3_ = 0;
              iVar2 = TestBody::anon_class_16_2_a4d0f9f0::operator()
                                (&verify_cert,
                                 (X509 *)not_dns._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                 0x4f0f73,(char *)piVar3);
              local_128._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_128._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2)
              ;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"62",
                         "verify_cert(not_dns.get(), 0 , kCommonNameNotDNS)",(int *)&gtest_ar_,
                         (int *)&local_128);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_128,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                           ,0xd20,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_128,(Message *)&gtest_ar_);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
                if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
                }
              }
              this_00 = &gtest_ar.message_;
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(this_00);
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&not_dns);
          }
          std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&not_permitted_with_sans);
        }
        std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&not_permitted);
      }
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&permitted);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&intermediate);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&root);
  return;
}

Assistant:

TEST(X509Test, CommonNameAndNameConstraints) {
  bssl::UniquePtr<X509> root = CertFromPEM(kSANTypesRoot);
  ASSERT_TRUE(root);
  bssl::UniquePtr<X509> intermediate = CertFromPEM(kConstrainedIntermediate);
  ASSERT_TRUE(intermediate);
  bssl::UniquePtr<X509> permitted = CertFromPEM(kCommonNamePermittedLeaf);
  ASSERT_TRUE(permitted);
  bssl::UniquePtr<X509> not_permitted =
      CertFromPEM(kCommonNameNotPermittedLeaf);
  ASSERT_TRUE(not_permitted);
  bssl::UniquePtr<X509> not_permitted_with_sans =
      CertFromPEM(kCommonNameNotPermittedWithSANsLeaf);
  ASSERT_TRUE(not_permitted_with_sans);
  bssl::UniquePtr<X509> not_dns = CertFromPEM(kCommonNameNotDNSLeaf);
  ASSERT_TRUE(not_dns);

  auto verify_cert = [&](X509 *leaf, unsigned flags, const char *host) {
    return Verify(
        leaf, {root.get()}, {intermediate.get()}, {}, 0,
        [&](X509_STORE_CTX *ctx) {
          X509_VERIFY_PARAM *param = X509_STORE_CTX_get0_param(ctx);
          ASSERT_TRUE(X509_VERIFY_PARAM_set1_host(param, host, strlen(host)));
          X509_VERIFY_PARAM_set_hostflags(param, flags);
        });
  };

  // Certificates which would otherwise trigger the common name fallback are
  // rejected whenever there are name constraints. We do this whether or not
  // the common name matches the constraints.
  EXPECT_EQ(
      X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
      verify_cert(permitted.get(), 0 /* no flags */, kCommonNamePermitted));
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            verify_cert(not_permitted.get(), 0 /* no flags */,
                        kCommonNameNotPermitted));

  // This occurs even if the built-in name checks aren't used. The caller may
  // separately call |X509_check_host|.
  EXPECT_EQ(X509_V_ERR_NAME_CONSTRAINTS_WITHOUT_SANS,
            Verify(not_permitted.get(), {root.get()}, {intermediate.get()}, {},
                   0 /* no flags */, nullptr));

  // If the leaf certificate has SANs, the common name fallback is always
  // disabled, so the name constraints do not apply.
  EXPECT_EQ(X509_V_OK, Verify(not_permitted_with_sans.get(), {root.get()},
                              {intermediate.get()}, {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_permitted_with_sans.get(), 0 /* no flags */,
                        kCommonNameNotPermittedWithSANs));

  // If the common name does not look like a DNS name, we apply neither name
  // constraints nor common name fallback.
  EXPECT_EQ(X509_V_OK, Verify(not_dns.get(), {root.get()}, {intermediate.get()},
                              {}, 0, nullptr));
  EXPECT_EQ(X509_V_ERR_HOSTNAME_MISMATCH,
            verify_cert(not_dns.get(), 0 /* no flags */, kCommonNameNotDNS));
}